

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O2

bool crnlib::image_utils::read_from_stream_stb(data_stream_serializer *serializer,image_u8 *img)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  int iVar4;
  bool bVar5;
  int py;
  int iVar6;
  uint uVar7;
  stbi_uc *retval_from_stbi_load;
  color_quad<unsigned_char,_int> *pcVar8;
  int iVar9;
  long lVar10;
  stbi_uc sVar11;
  byte bVar12;
  int y;
  int x;
  int n;
  uint8_vec buf;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_24;
  
  buf.m_p = (uchar *)0x0;
  buf.m_size = 0;
  buf.m_capacity = 0;
  bVar5 = data_stream_serializer::read_entire_file(serializer,&buf);
  if (bVar5) {
    x = 0;
    y = 0;
    n = 0;
    retval_from_stbi_load = stbi_load_from_memory(buf.m_p,buf.m_size,&x,&y,&n,4);
    iVar4 = n;
    if (retval_from_stbi_load != (stbi_uc *)0x0) {
      if (y < 0x4001 && x < 0x4001) {
        local_24.m_u32 = 0xff000000;
        image<crnlib::color_quad<unsigned_char,_int>_>::resize
                  (img,x,y,0xffffffff,(color_quad<unsigned_char,_int> *)&local_24.field_0);
        bVar12 = 1;
        for (iVar6 = 0; iVar6 < y; iVar6 = iVar6 + 1) {
          pcVar8 = img->m_pPixels + img->m_pitch * iVar6;
          iVar9 = x * iVar6;
          for (lVar10 = 0; (long)x * 4 != lVar10; lVar10 = lVar10 + 4) {
            sVar11 = retval_from_stbi_load[lVar10 + (long)iVar9 * 4 + 3];
            if ((iVar4 != 2) && (iVar4 != 4)) {
              sVar11 = 0xff;
            }
            sVar1 = retval_from_stbi_load[lVar10 + (long)iVar9 * 4];
            sVar2 = retval_from_stbi_load[lVar10 + (long)iVar9 * 4 + 1];
            sVar3 = retval_from_stbi_load[lVar10 + (long)iVar9 * 4 + 2];
            (pcVar8->field_0).field_0.r = sVar1;
            (pcVar8->field_0).field_0.g = sVar2;
            bVar12 = bVar12 & (sVar2 == sVar3 && sVar1 == sVar2);
            (pcVar8->field_0).field_0.b = sVar3;
            (pcVar8->field_0).field_0.a = sVar11;
            pcVar8 = pcVar8 + 1;
          }
        }
        stbi_image_free(retval_from_stbi_load);
        uVar7 = (uint)bVar12 << 4 | 0xf;
        img->m_comp_flags = uVar7;
        if ((iVar4 != 2) && (iVar4 != 4)) {
          uVar7 = (uint)bVar12 << 4 | 7;
        }
        img->m_comp_flags = uVar7;
        bVar5 = true;
        goto LAB_001165bb;
      }
      stbi_image_free(retval_from_stbi_load);
    }
  }
  bVar5 = false;
LAB_001165bb:
  vector<unsigned_char>::~vector(&buf);
  return bVar5;
}

Assistant:

bool read_from_stream_stb(data_stream_serializer& serializer, image_u8& img) {
  uint8_vec buf;
  if (!serializer.read_entire_file(buf))
    return false;

  int x = 0, y = 0, n = 0;
  unsigned char* pData = stbi_load_from_memory(buf.get_ptr(), buf.size_in_bytes(), &x, &y, &n, 4);

  if (!pData)
    return false;

  if ((x > (int)CRNLIB_LARGEST_SUPPORTED_IMAGE_DIMENSION) || (y > (int)CRNLIB_LARGEST_SUPPORTED_IMAGE_DIMENSION)) {
    stbi_image_free(pData);
    return false;
  }

  const bool has_alpha = ((n == 2) || (n == 4));

  img.resize(x, y);

  bool grayscale = true;

  for (int py = 0; py < y; py++) {
    const color_quad_u8* pSrc = reinterpret_cast<const color_quad_u8*>(pData) + (py * x);
    color_quad_u8* pDst = img.get_scanline(py);
    color_quad_u8* pDst_end = pDst + x;

    while (pDst != pDst_end) {
      color_quad_u8 c(*pSrc++);
      if (!has_alpha)
        c.a = 255;

      if (!c.is_grayscale())
        grayscale = false;

      *pDst++ = c;
    }
  }

  stbi_image_free(pData);

  img.reset_comp_flags();
  img.set_grayscale(grayscale);
  img.set_component_valid(3, has_alpha);

  return true;
}